

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.h
# Opt level: O0

void __thiscall PEFile::~PEFile(PEFile *this)

{
  PEFile *this_local;
  
  (this->super_MappedExe).super_Executable.super_AbstractByteBuffer._vptr_AbstractByteBuffer =
       (_func_int **)&PTR__PEFile_0018dfb8;
  (this->super_MappedExe).super_ExeWrappersContainer._vptr_ExeWrappersContainer =
       (_func_int **)&PTR__PEFile_0018e0d8;
  (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x21]
  )();
  if (this->album != (ResourcesAlbum *)0x0) {
    (*this->album->_vptr_ResourcesAlbum[1])();
  }
  QMutex::~QMutex(&this->m_peMutex);
  PECore::~PECore(&this->core);
  MappedExe::~MappedExe(&this->super_MappedExe);
  return;
}

Assistant:

virtual ~PEFile() { clearWrappers(); delete album; }